

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O2

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* PolynomialGenerateCombinations
            (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *vec_in)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  size_t j;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  allocator_type local_41;
  ulong local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  lVar3 = (long)(vec_in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vec_in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar4 = lVar3 >> 3;
  auVar8._8_4_ = (int)(lVar3 >> 0x23);
  auVar8._0_8_ = lVar4;
  auVar8._12_4_ = 0x45300000;
  dVar7 = exp2((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
  local_40 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
  puVar1 = (vec_in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (vec_in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = vec_in;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(__return_storage_ptr__,local_40,&local_41);
  for (uVar6 = 0; uVar6 != local_40; uVar6 = uVar6 + 1) {
    lVar3 = 0;
    for (uVar5 = 0; (long)puVar1 - (long)puVar2 >> 3 != uVar5; uVar5 = uVar5 + 1) {
      if ((uVar6 >> (uVar5 & 0x3f) & 1) != 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((__return_storage_ptr__->
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar6,
                   (value_type_conflict1 *)
                   ((long)(local_38->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar3));
      }
      lVar3 = lVar3 + 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<openjij::graph::Index>> PolynomialGenerateCombinations(const std::vector<openjij::graph::Index> &vec_in) {
   const std::size_t loop = static_cast<std::size_t>(std::pow(2, vec_in.size()));
   const std::size_t num  = vec_in.size();
   std::vector<std::vector<openjij::graph::Index>> vec_out(loop);
   for (std::size_t i = 0; i < loop; ++i) {
      std::bitset<64> bs(i);
      for (std::size_t j = 0; j < num; ++j) {
         if (bs[j]) {
            vec_out[i].push_back(vec_in[j]);
         }
      }
   }
   return vec_out;
}